

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

Object * env_arr_get(Object *__return_storage_ptr__,char *identifer,int line,long index,
                    Environment *env)

{
  Record *pRVar1;
  Record *get;
  Environment *env_local;
  long index_local;
  int line_local;
  char *identifer_local;
  
  pRVar1 = env_match(identifer,env);
  if (env == (Environment *)0x0) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Undefined array %s!\x1b[0m",(ulong)(uint)line,
           identifer);
    stop();
  }
  else if ((pRVar1->object).type != OBJECT_ARRAY) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Subscripted variable %s is not an array or string!\x1b[0m"
           ,(ulong)(uint)line,identifer);
    stop();
  }
  if ((index < 1) || ((pRVar1->object).field_1.literal.line < index)) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Array index out of range [%ld]!\x1b[0m",
           (ulong)(uint)line,index);
    stop();
  }
  memcpy(__return_storage_ptr__,(pRVar1->object).field_1.arr.values + index + -1,0x40);
  return __return_storage_ptr__;
}

Assistant:

Object env_arr_get(char *identifer, int line, long index, Environment *env){ 
    Record *get = env_match(identifer, env);
    if(env == NULL){
        printf(runtime_error("Undefined array %s!"), line, identifer);
        stop();
    }
    else if(get->object.type != OBJECT_ARRAY){
        printf(runtime_error("Subscripted variable %s is not an array or string!"), line, identifer);
        stop();
    }
    if(index < 1 || get->object.arr.count < index){
        printf(runtime_error("Array index out of range [%ld]!"), line, index);
        stop();
    }
    return get->object.arr.values[index - 1];
}